

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort-dns.c
# Opt level: O2

int lws_sort_dns(lws *wsi,addrinfo *result)

{
  char cVar1;
  lws_context *plVar2;
  lws_log_cx *plVar3;
  lws_dll2 *plVar4;
  lws_route_t *plVar5;
  lws_dll2_owner **sa46;
  ulong uVar6;
  lws_dns_sort_t *s;
  char afip [48];
  char local_68 [56];
  
  plVar2 = (wsi->a).context;
  cVar1 = wsi->tsi;
  plVar3 = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(plVar3,lws_log_prepend_wsi,wsi,8,"lws_sort_dns","sort_dns: %p",result);
  do {
    if (result == (addrinfo *)0x0) {
      if ((wsi->dns_sorted_list).head == (lws_dll2 *)0x0) {
        plVar3 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar3,lws_log_prepend_wsi,wsi,4,"lws_sort_dns_dump","empty");
      }
      plVar4 = (lws_dll2 *)&wsi->dns_sorted_list;
      uVar6 = 1;
      while (plVar4 = plVar4->next, plVar4 != (lws_dll2 *)0x0) {
        lws_sa46_write_numeric_address((lws_sockaddr46 *)&plVar4[1].owner,afip,0x30);
        lws_sa46_write_numeric_address((lws_sockaddr46 *)&plVar4[2].next,local_68,0x30);
        plVar3 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar3,lws_log_prepend_wsi,wsi,8,"lws_sort_dns_dump",
                    "%d: (%d)%s, gw (%d)%s, idi: %d, lbl: %d, prec: %d",uVar6,
                    (ulong)*(ushort *)&plVar4[1].owner,afip,(ulong)*(ushort *)&plVar4[2].next,
                    local_68,(ulong)*(uint *)((long)&plVar4[3].next + 4),
                    (ulong)*(byte *)((long)&plVar4[3].next + 1),(ulong)*(byte *)&plVar4[3].next);
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      return (uint)((wsi->dns_sorted_list).count == 0);
    }
    if (((int)result->ai_addrlen < 0x11) && ((result->ai_family | 8U) == 10)) {
      plVar4 = (lws_dll2 *)lws_zalloc(0x68,"lws_sort_dns");
      if (plVar4 == (lws_dll2 *)0x0) {
        return 1;
      }
      sa46 = &plVar4[1].owner;
      memcpy(sa46,result->ai_addr,(ulong)result->ai_addrlen);
      *(short *)&plVar4[1].owner = (short)result->ai_family;
      lws_sa46_write_numeric_address((lws_sockaddr46 *)sa46,afip,0x30);
      plVar3 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar3,lws_log_prepend_wsi,wsi,8,"lws_sort_dns","unsorted entry (af %d) %s",
                  (ulong)*(ushort *)&plVar4[1].owner,afip);
      if (((plVar2->pt[cVar1].context)->routing_table).count != 0) {
        plVar5 = _lws_route_est_outgoing(plVar2->pt + cVar1,(lws_sockaddr46 *)sa46);
        if (plVar5 == (lws_route_t *)0x0) {
          lws_realloc(plVar4,0,"lws_free");
          plVar3 = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(plVar3,lws_log_prepend_wsi,wsi,4,"lws_sort_dns","%s has no route out\n",afip);
          goto LAB_00139e54;
        }
        *(int *)((long)&plVar4[3].next + 4) = plVar5->if_idx;
        *(lws_route_uidx_t *)&plVar4[4].prev = plVar5->uidx;
      }
      lws_dll2_add_tail(plVar4,&wsi->dns_sorted_list);
    }
LAB_00139e54:
    result = result->ai_next;
  } while( true );
}

Assistant:

int
lws_sort_dns(struct lws *wsi, const struct addrinfo *result)
{
#if defined(LWS_WITH_NETLINK)
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
#endif
	const struct addrinfo *ai = result;

	lwsl_wsi_info(wsi, "sort_dns: %p", result);

	/*
	 * We're going to take the dns results and produce our own linked-list
	 * of them, if we can sorted into descending preferability order, and
	 * possibly filtered.
	 *
	 * First let's just convert the addrinfo list into our expanded
	 * lws_dns_sort_t list, we can discard the addrinfo list then
	 */

	while (ai) {
#if defined(LWS_WITH_NETLINK) || \
	(defined(LWS_WITH_NETLINK) && defined(LWS_WITH_IPV6))
		lws_route_t
#if defined(LWS_WITH_NETLINK)
			*estr = NULL
#endif
#if defined(LWS_WITH_NETLINK) && defined(LWS_WITH_IPV6)
			, *bestsrc = NULL
#endif
		;
#endif
		lws_dns_sort_t *ds;
		char afip[48];

		/*
		 * Only transfer address families we can cope with
		 */
		if ((int)ai->ai_addrlen > (int)sizeof(lws_sockaddr46) ||
		    (ai->ai_family != AF_INET && ai->ai_family != AF_INET6))
			goto next;

		ds = lws_zalloc(sizeof(*ds), __func__);
		if (!ds)
			return 1;

		memcpy(&ds->dest, ai->ai_addr, (size_t)ai->ai_addrlen);
		ds->dest.sa4.sin_family = (sa_family_t)ai->ai_family;

		lws_sa46_write_numeric_address(&ds->dest, afip, sizeof(afip));

		lwsl_wsi_info(wsi, "unsorted entry (af %d) %s",
				   ds->dest.sa4.sin_family, afip);

#if defined(LWS_WITH_NETLINK)

		/*
		 * Let's assess this DNS result in terms of route
		 * selection, eg, if no usable net route or gateway for it,
		 * we don't have a way to use it if we listed it
		 */

		if (pt->context->routing_table.count) {

			estr = _lws_route_est_outgoing(pt, &ds->dest);
			if (!estr) {
				lws_free(ds);
				lwsl_wsi_notice(wsi, "%s has no route out\n",
						afip);
				/*
				 * There's no outbound route for this, it's
				 * unusable, so don't add it to the list
				 */
				goto next;
			}

			ds->if_idx = estr->if_idx;
			ds->uidx = estr->uidx;

			/*
			 * ...evidently, there's a way for it to go out...
			 */
		}
#endif

#if defined(LWS_WITH_NETLINK) && defined(LWS_WITH_IPV6)

		/*
		 * These sorting rules only apply to ipv6.  If we have ipv4
		 * dest and estimate we will use an ipv4 source address to
		 * route it, then skip this.
		 *
		 * However if we have ipv4 dest and estimate we will use an
		 * ipv6 source address to route it, because of ipv6-only
		 * egress, then promote it to ipv6 and sort it
		 */

		if (ds->dest.sa4.sin_family == AF_INET) {
			if (!estr ||
			    estr->dest.sa4.sin_family == AF_INET ||
			    estr->gateway.sa4.sin_family == AF_INET)
				/*
				 * No estimated route, or v4 estimated route,
				 * just add it to sorted list
				 */
				goto just_add;

			/*
			 * v4 dest on estimated v6 source ads route, because
			 * eg, there's no active v4 source ads just ipv6...
			 * promote v4 -> v6 address using ::ffff:xx:yy
			 */

			lwsl_wsi_info(wsi, "promoting v4->v6");

			lws_sa46_4to6(&ds->dest,
				      (uint8_t *)&ds->dest.sa4.sin_addr, 0);
		}

		/* first, classify this destination ads */
		lws_sort_dns_classify(&ds->dest, &ds->score);

		/*
		 * RFC6724 Section 5: Source Address Selection
		 *
		 * Go through the source options choosing the best for this
		 * destination... this can only operate on ipv6 destination
		 * address
		 */

		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&pt->context->routing_table)) {
			lws_route_t *r = lws_container_of(d, lws_route_t, list);

			/* gateway routes are skipped here */

			if (ds->dest.sa6.sin6_family == AF_INET6 &&
			    r->dest.sa4.sin_family == AF_INET6 && (!bestsrc ||
			    lws_sort_dns_scomp(pt, bestsrc, r, &ds->dest.sa6) ==
							    SAS_PREFER_B))
				bestsrc = r;

		} lws_end_foreach_dll(d);

		/* bestsrc is the best source route, or NULL if none */

		if (!bestsrc && pt->context->routing_table.count) {
			/* drop it, no usable source route */
			lws_free(ds);
			goto next;
		}

just_add:
		if (!bestsrc) {
			lws_dll2_add_tail(&ds->list, &wsi->dns_sorted_list);
			goto next;
		}

		ds->source = bestsrc;

		/*
		 * RFC6724 Section 6: Destination Address Selection
		 *
		 * Insert the destination into the list at a position reflecting
		 * its preferability, so the head entry is the most preferred
		 */

		lws_dll2_add_sorted(&ds->list, &wsi->dns_sorted_list,
				    lws_sort_dns_compare);
#else
		/*
		 * We don't have the routing table + source address details in
		 * order to sort the DNS results... simply make entries in the
		 * order of the addrinfo results
		 */

		lws_dll2_add_tail(&ds->list, &wsi->dns_sorted_list);
#endif

next:
		ai = ai->ai_next;
	}

	//lwsl_notice("%s: sorted table: %d\n", __func__,
	//		wsi->dns_sorted_list.count);

#if defined(_DEBUG)
	lws_sort_dns_dump(wsi);
#endif

	return !wsi->dns_sorted_list.count;
}